

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ssize_t ossl_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t buffersize,CURLcode *curlcode)

{
  uint err;
  connectdata *conn;
  long lVar1;
  int ret_code;
  int err_00;
  ulong error;
  uint *puVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char error_buffer [256];
  char local_138 [264];
  
  conn = cf->conn;
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  ERR_clear_error();
  sVar4 = 0x7fffffff;
  if (buffersize < 0x7fffffff) {
    sVar4 = buffersize;
  }
  ret_code = SSL_read(*(SSL **)(lVar1 + 8),buf,(int)sVar4);
  lVar5 = (long)ret_code;
  if (0 < ret_code) {
    return lVar5;
  }
  err_00 = SSL_get_error(*(SSL **)(lVar1 + 8),ret_code);
  if (1 < err_00 - 2U) {
    if (err_00 == 0) {
      return lVar5;
    }
    if (err_00 == 6) {
      if (cf->sockindex == 0) {
        Curl_conncontrol(conn,1);
        return lVar5;
      }
      return lVar5;
    }
    if (*(int *)(lVar1 + 0x20) != 0x51) {
      error = ERR_get_error();
      if (error != 0 || ret_code != 0) {
        puVar2 = (uint *)__errno_location();
        err = *puVar2;
        if (error == 0) {
          if (err_00 == 5 && err != 0) {
            Curl_strerror(err,local_138,0x100);
          }
          else {
            pcVar3 = SSL_ERROR_to_str(err_00);
            curl_msnprintf(local_138,0x100,"%s",pcVar3);
          }
        }
        else {
          ossl_strerror(error,local_138,0x100);
        }
        Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",local_138,(ulong)err);
        *curlcode = CURLE_RECV_ERROR;
        return -1;
      }
      return 0;
    }
  }
  *curlcode = CURLE_AGAIN;
  return -1;
}

Assistant:

static ssize_t ossl_recv(struct Curl_cfilter *cf,
                         struct Curl_easy *data,   /* transfer */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  struct connectdata *conn = cf->conn;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;

  (void)data;
  DEBUGASSERT(backend);

  ERR_clear_error();

  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  nread = (ssize_t)SSL_read(backend->handle, buf, buffsize);

  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(backend->handle, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
      break;
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      /* close_notify alert */
      if(cf->sockindex == FIRSTSOCKET)
        /* mark the connection for close if it is indeed the control
           connection */
        connclose(conn, "TLS close_notify");
      break;
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* there's data pending, re-invoke SSL_read() */
      *curlcode = CURLE_AGAIN;
      nread = -1;
      goto out;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://www.openssl.org/docs/crypto/ERR_get_error.html */
      if(backend->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        nread = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        int sockerr = SOCKERRNO;
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr && err == SSL_ERROR_SYSCALL)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else
          msnprintf(error_buffer, sizeof(error_buffer), "%s",
                    SSL_ERROR_to_str(err));
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
      /* For debug builds be a little stricter and error on any
         SSL_ERROR_SYSCALL. For example a server may have closed the connection
         abruptly without a close_notify alert. For compatibility with older
         peers we don't do this by default. #4624

         We can use this to gauge how many users may be affected, and
         if it goes ok eventually transition to allow in dev and release with
         the newest OpenSSL: #if (OPENSSL_VERSION_NUMBER >= 0x10101000L) */
#ifdef DEBUGBUILD
      if(err == SSL_ERROR_SYSCALL) {
        int sockerr = SOCKERRNO;
        if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          msnprintf(error_buffer, sizeof(error_buffer),
                    "Connection closed abruptly");
        }
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d"
              " (Fatal because this is a curl debug build)",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
#endif
    }
  }

out:
  return nread;
}